

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O2

bool __thiscall MipsParser::decodeVfpuType(MipsParser *this,string *name,size_t *pos,int *dest)

{
  ulong uVar1;
  
  uVar1 = *pos;
  if (name->_M_string_length <= uVar1) {
    return false;
  }
  *pos = uVar1 + 1;
  switch((name->_M_dataplus)._M_p[uVar1]) {
  case 'p':
    *dest = 1;
    break;
  case 'q':
    *dest = 3;
    break;
  default:
    *pos = uVar1;
    return false;
  case 's':
    *dest = 0;
    break;
  case 't':
    *dest = 2;
  }
  return true;
}

Assistant:

bool MipsParser::decodeVfpuType(const std::string& name, size_t& pos, int& dest)
{
	if (pos >= name.size())
		return false;

	switch (name[pos++])
	{
	case 's':
		dest = 0;
		return true;
	case 'p':
		dest = 1;
		return true;
	case 't':
		dest = 2;
		return true;
	case 'q':
		dest = 3;
		return true;
	}

	pos--;
	return false;
}